

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

int cloneMqttOptions(MQTT_CLIENT *mqtt_client,MQTT_CLIENT_OPTIONS *mqttOptions)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *temp_option;
  MQTT_CLIENT_OPTIONS *pMStack_18;
  int result;
  MQTT_CLIENT_OPTIONS *mqttOptions_local;
  MQTT_CLIENT *mqtt_client_local;
  
  temp_option._4_4_ = 0;
  pMStack_18 = mqttOptions;
  mqttOptions_local = (MQTT_CLIENT_OPTIONS *)mqtt_client;
  if (mqttOptions->clientId != (char *)0x0) {
    iVar1 = mallocAndStrcpy_s((char **)&l,mqttOptions->clientId);
    if (iVar1 == 0) {
      if (*(long *)&mqttOptions_local[1].log_trace != 0) {
        free(*(void **)&mqttOptions_local[1].log_trace);
      }
      *(LOGGER_LOG *)&mqttOptions_local[1].log_trace = l;
    }
    else {
      temp_option._4_4_ = 0x222;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"cloneMqttOptions",0x223,1,"mallocAndStrcpy_s clientId");
      }
    }
  }
  if ((temp_option._4_4_ == 0) && (pMStack_18->willTopic != (char *)0x0)) {
    l = (LOGGER_LOG)0x0;
    iVar1 = mallocAndStrcpy_s((char **)&l,pMStack_18->willTopic);
    if (iVar1 == 0) {
      if (mqttOptions_local[2].clientId != (char *)0x0) {
        free(mqttOptions_local[2].clientId);
      }
      mqttOptions_local[2].clientId = (char *)l;
    }
    else {
      temp_option._4_4_ = 0x233;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"cloneMqttOptions",0x234,1,"mallocAndStrcpy_s willTopic");
      }
    }
  }
  if ((temp_option._4_4_ == 0) && (pMStack_18->willMessage != (char *)0x0)) {
    l = (LOGGER_LOG)0x0;
    iVar1 = mallocAndStrcpy_s((char **)&l,pMStack_18->willMessage);
    if (iVar1 == 0) {
      if (mqttOptions_local[2].willTopic != (char *)0x0) {
        free(mqttOptions_local[2].willTopic);
      }
      mqttOptions_local[2].willTopic = (char *)l;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"cloneMqttOptions",0x244,1,"mallocAndStrcpy_s willMessage");
      }
      temp_option._4_4_ = 0x245;
    }
  }
  if ((temp_option._4_4_ == 0) && (pMStack_18->username != (char *)0x0)) {
    l = (LOGGER_LOG)0x0;
    iVar1 = mallocAndStrcpy_s((char **)&l,pMStack_18->username);
    if (iVar1 == 0) {
      if (mqttOptions_local[2].willMessage != (char *)0x0) {
        free(mqttOptions_local[2].willMessage);
      }
      mqttOptions_local[2].willMessage = (char *)l;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"cloneMqttOptions",0x255,1,"mallocAndStrcpy_s username");
      }
      temp_option._4_4_ = 0x256;
    }
  }
  if ((temp_option._4_4_ == 0) && (pMStack_18->password != (char *)0x0)) {
    l = (LOGGER_LOG)0x0;
    iVar1 = mallocAndStrcpy_s((char **)&l,pMStack_18->password);
    if (iVar1 == 0) {
      if (mqttOptions_local[2].username != (char *)0x0) {
        free(mqttOptions_local[2].username);
      }
      mqttOptions_local[2].username = (char *)l;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                  ,"cloneMqttOptions",0x266,1,"mallocAndStrcpy_s password");
      }
      temp_option._4_4_ = 0x267;
    }
  }
  if (temp_option._4_4_ == 0) {
    *(uint16_t *)&mqttOptions_local[2].password = pMStack_18->keepAliveInterval;
    *(byte *)((long)&mqttOptions_local[2].password + 2) = pMStack_18->messageRetain & 1;
    *(byte *)((long)&mqttOptions_local[2].password + 3) = pMStack_18->useCleanSession & 1;
    *(QOS_VALUE *)((long)&mqttOptions_local[2].password + 4) = pMStack_18->qualityOfServiceValue;
  }
  else {
    clear_mqtt_options((MQTT_CLIENT *)mqttOptions_local);
  }
  return temp_option._4_4_;
}

Assistant:

static int cloneMqttOptions(MQTT_CLIENT* mqtt_client, const MQTT_CLIENT_OPTIONS* mqttOptions)
{
    int result = 0;
    char* temp_option;

    if (mqttOptions->clientId != NULL)
    {
        if (mallocAndStrcpy_s(&temp_option, mqttOptions->clientId) != 0)
        {
            result = MU_FAILURE;
            LogError("mallocAndStrcpy_s clientId");
        }
        else
        {
            if (mqtt_client->mqttOptions.clientId != NULL)
            {
                free(mqtt_client->mqttOptions.clientId);
            }
            mqtt_client->mqttOptions.clientId = temp_option;
        }
    }
    if (result == 0 && mqttOptions->willTopic != NULL)
    {
        temp_option = NULL;
        if (mallocAndStrcpy_s(&temp_option, mqttOptions->willTopic) != 0)
        {
            result = MU_FAILURE;
            LogError("mallocAndStrcpy_s willTopic");
        }
        else
        {
            if (mqtt_client->mqttOptions.willTopic != NULL)
            {
                free(mqtt_client->mqttOptions.willTopic);
            }
            mqtt_client->mqttOptions.willTopic = temp_option;
        }
    }
    if (result == 0 && mqttOptions->willMessage != NULL)
    {
        temp_option = NULL;
        if (mallocAndStrcpy_s(&temp_option, mqttOptions->willMessage) != 0)
        {
            LogError("mallocAndStrcpy_s willMessage");
            result = MU_FAILURE;
        }
        else
        {
            if (mqtt_client->mqttOptions.willMessage != NULL)
            {
                free(mqtt_client->mqttOptions.willMessage);
            }
            mqtt_client->mqttOptions.willMessage = temp_option;
        }
    }
    if (result == 0 && mqttOptions->username != NULL)
    {
        temp_option = NULL;
        if (mallocAndStrcpy_s(&temp_option, mqttOptions->username) != 0)
        {
            LogError("mallocAndStrcpy_s username");
            result = MU_FAILURE;
        }
        else
        {
            if (mqtt_client->mqttOptions.username != NULL)
            {
                free(mqtt_client->mqttOptions.username);
            }
            mqtt_client->mqttOptions.username = temp_option;
        }
    }
    if (result == 0 && mqttOptions->password != NULL)
    {
        temp_option = NULL;
        if (mallocAndStrcpy_s(&temp_option, mqttOptions->password) != 0)
        {
            LogError("mallocAndStrcpy_s password");
            result = MU_FAILURE;
        }
        else
        {
            if (mqtt_client->mqttOptions.password != NULL)
            {
                free(mqtt_client->mqttOptions.password);
            }
            mqtt_client->mqttOptions.password = temp_option;
        }
    }
    if (result == 0)
    {
        mqtt_client->mqttOptions.keepAliveInterval = mqttOptions->keepAliveInterval;
        mqtt_client->mqttOptions.messageRetain = mqttOptions->messageRetain;
        mqtt_client->mqttOptions.useCleanSession = mqttOptions->useCleanSession;
        mqtt_client->mqttOptions.qualityOfServiceValue = mqttOptions->qualityOfServiceValue;
    }
    else
    {
        clear_mqtt_options(mqtt_client);
    }
    return result;
}